

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::GetPublicKeyInToken
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aPublicKey)

{
  bool bVar1;
  Error *pEVar2;
  uchar *aBuf;
  size_type aMaxLength;
  ErrorCode local_144;
  Error local_140;
  ErrorCode local_114;
  Error local_110;
  ErrorCode local_e4;
  Error local_e0;
  ErrorCode local_b4;
  Error local_b0;
  size_type local_88;
  size_t publicKeyLength;
  CborMap publicKey;
  CborMap cnf;
  undefined1 local_40 [8];
  CborMap token;
  ByteArray *aPublicKey_local;
  TokenManager *this_local;
  Error *error;
  
  token.super_CborValue.mCbor._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  CborMap::CborMap((CborMap *)local_40);
  CborMap::CborMap((CborMap *)&publicKey.super_CborValue.mCbor);
  CborMap::CborMap((CborMap *)&publicKeyLength);
  ValidateToken(&local_b0,this,(CborMap *)local_40,&this->mSignedToken,&this->mDomainCAPublicKey);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_b0);
  local_b4 = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_b4);
  Error::~Error(&local_b0);
  if (!bVar1) {
    CborMap::Get(&local_e0,(CborMap *)local_40,8,(CborMap *)&publicKey.super_CborValue.mCbor);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_e0);
    local_e4 = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_e4);
    Error::~Error(&local_e0);
    if (!bVar1) {
      CborMap::Get(&local_110,(CborMap *)&publicKey.super_CborValue.mCbor,1,
                   (CborMap *)&publicKeyLength);
      pEVar2 = Error::operator=(__return_storage_ptr__,&local_110);
      local_114 = kNone;
      bVar1 = commissioner::operator!=(pEVar2,&local_114);
      Error::~Error(&local_110);
      if (!bVar1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPublicKey,0x400);
        aBuf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(aPublicKey);
        aMaxLength = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aPublicKey);
        CborValue::Serialize(&local_140,(CborValue *)&publicKeyLength,aBuf,&local_88,aMaxLength);
        local_144 = kNone;
        bVar1 = commissioner::operator==(&local_140,&local_144);
        Error::~Error(&local_140);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          abort();
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPublicKey,local_88);
      }
    }
  }
  CborValue::Free((CborValue *)local_40);
  token.super_CborValue.mCbor._7_1_ = 1;
  CborMap::~CborMap((CborMap *)&publicKeyLength);
  CborMap::~CborMap((CborMap *)&publicKey.super_CborValue.mCbor);
  CborMap::~CborMap((CborMap *)local_40);
  if ((token.super_CborValue.mCbor._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetPublicKeyInToken(ByteArray &aPublicKey) const
{
    static constexpr size_t kMaxSignedTokenLength = 1024;

    Error   error;
    CborMap token;
    CborMap cnf;
    CborMap publicKey;
    size_t  publicKeyLength;

    SuccessOrExit(error = ValidateToken(token, mSignedToken, mDomainCAPublicKey));
    SuccessOrExit(error = token.Get(cwt::kCnf, cnf));
    SuccessOrExit(error = cnf.Get(cwt::kCoseKey, publicKey));

    aPublicKey.resize(kMaxSignedTokenLength);
    SuccessOrDie(publicKey.Serialize(aPublicKey.data(), publicKeyLength, aPublicKey.size()));
    aPublicKey.resize(publicKeyLength);

exit:
    token.Free();
    return error;
}